

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool detect_stuff(effect_handler_context_t_conflict *context,_func__Bool_object_ptr *pred)

{
  _Bool _Var1;
  int iVar2;
  loc grid;
  object *obj;
  int iVar3;
  int y;
  int iVar4;
  int iVar5;
  int iVar6;
  
  iVar4 = (player->grid).x;
  iVar3 = (player->grid).y;
  y = iVar3 - context->y;
  iVar3 = context->y + iVar3;
  iVar2 = iVar4 - context->x;
  iVar4 = context->x + iVar4;
  iVar6 = 0;
  if (y < 1) {
    y = iVar6;
  }
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  iVar5 = cave->height + -1;
  if (iVar3 < cave->height) {
    iVar5 = iVar3;
  }
  iVar3 = cave->width + -1;
  if (iVar4 < cave->width) {
    iVar3 = iVar4;
  }
  for (; iVar4 = iVar2, y <= iVar5; y = y + 1) {
    for (; iVar4 <= iVar3; iVar4 = iVar4 + 1) {
      grid = (loc)loc(iVar4,y);
      for (obj = square_object(cave,grid); (iVar6 == 0 && (obj != (object *)0x0)); obj = obj->next)
      {
        _Var1 = (*pred)(obj);
        if ((_Var1) && (_Var1 = ignore_item_ok(player,obj), !_Var1)) {
          iVar6 = 1;
        }
      }
      square_know_pile(cave,grid,pred);
    }
  }
  return SUB41(iVar6,0);
}

Assistant:

static bool detect_stuff(effect_handler_context_t *context,
		bool (*pred)(const struct object*))
{
	int x, y;
	int x1, x2, y1, y2;

	bool have_stuff = false;

	/* Pick an area to detect */
	y1 = player->grid.y - context->y;
	y2 = player->grid.y + context->y;
	x1 = player->grid.x - context->x;
	x2 = player->grid.x + context->x;

	if (y1 < 0) y1 = 0;
	if (x1 < 0) x1 = 0;
	if (y2 > cave->height - 1) y2 = cave->height - 1;
	if (x2 > cave->width - 1) x2 = cave->width - 1;

	/* Scan the area */
	for (y = y1; y <= y2; y++) {
		for (x = x1; x <= x2; x++) {
			struct loc grid = loc(x, y);
			struct object *obj = square_object(cave, grid);

			/*
			 * Is there any object matching the predicate which is
			 * not ignored?
			 */
			for (; !have_stuff && obj; obj = obj->next) {
				if ((*pred)(obj) && !ignore_item_ok(player, obj)) {
					have_stuff = true;
				}
			}

			/*
			 * Mark the parts of the pile that match the predicate
			 * as seen.  Forget remembered parts that match the
			 * predicate which are no longer there.
			 */
			square_know_pile(cave, grid, pred);
		}
	}

	return have_stuff;
}